

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ConstantDerivateCase::verify
          (ConstantDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  TestLog *log;
  undefined7 extraout_var;
  Vector<float,_4> local_60;
  undefined1 local_50 [24];
  Vec4 threshold;
  Vec4 reference;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  ConstantDerivateCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(threshold.m_data + 2),0.0);
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)local_50);
  tcu::abs<float,4>((tcu *)&local_60,&(this->super_TriangleDerivateCase).m_derivScale);
  tcu::operator/((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&local_60);
  log = tcu::TestContext::getLog
                  ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  bVar1 = verifyConstantDerivate
                    (log,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                     (this->super_TriangleDerivateCase).m_dataType,(Vec4 *)(threshold.m_data + 2),
                     (Vec4 *)(local_50 + 0x10),&(this->super_TriangleDerivateCase).m_derivScale,
                     &(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ConstantDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_derivScale);

	return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								  reference, threshold, m_derivScale, m_derivBias);
}